

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddVirtualOne
              (WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUsable,u16 mExclude,
              sqlite3_index_info *pIdxInfo,u16 mNoOmit,int *pbIn,int *pbRetryLimit)

{
  int iVar1;
  WhereClause *pWC_00;
  sqlite3_index_constraint_usage *aUsage;
  ulong *puVar2;
  LogEst LVar3;
  int iVar4;
  WhereLoop *pTemplate;
  WhereTerm *pTerm_00;
  ushort in_CX;
  ulong in_RDX;
  ulong in_RSI;
  long *in_RDI;
  int *in_R8;
  ushort in_R9W;
  int *in_stack_00000008;
  undefined4 *in_stack_00000010;
  int j;
  WhereTerm *pTerm_1;
  int iTerm;
  WhereTerm *pTerm;
  int nConstraint;
  SrcItem *pSrc;
  Parse *pParse;
  WhereLoop *pNew;
  int rc;
  int mxTerm;
  int i;
  sqlite3_index_constraint_usage *pUsage;
  sqlite3_index_constraint *pIdxCons;
  HiddenIndexInfo *pHidden;
  WhereClause *pWC;
  undefined1 local_ac;
  uint in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  sqlite3_index_info *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  Parse *in_stack_ffffffffffffff70;
  Parse *pParse_00;
  int local_60;
  int local_5c;
  long local_50;
  int local_4;
  
  pWC_00 = (WhereClause *)in_RDI[1];
  aUsage = *(sqlite3_index_constraint_usage **)(in_R8 + 8);
  puVar2 = (ulong *)in_RDI[2];
  pParse_00 = *(Parse **)*in_RDI;
  pTemplate = (WhereLoop *)(*(long *)(*in_RDI + 8) + 8 + (ulong)(byte)puVar2[2] * 0x48);
  iVar1 = *in_R8;
  *in_stack_00000008 = 0;
  *puVar2 = in_RSI;
  local_50 = *(long *)(in_R8 + 2);
  for (local_5c = 0; local_5c < iVar1; local_5c = local_5c + 1) {
    in_stack_ffffffffffffff70 = (Parse *)termFromWhereClause(pWC_00,*(int *)(local_50 + 8));
    *(undefined1 *)(local_50 + 5) = 0;
    if ((((*(ulong *)&in_stack_ffffffffffffff70->mSubrtnSig & in_RDX) ==
          *(Bitmask *)&in_stack_ffffffffffffff70->mSubrtnSig) &&
        ((*(u16 *)((long)&in_stack_ffffffffffffff70->pVdbe + 4) & in_CX) == 0)) &&
       ((in_stack_00000010 != (undefined4 *)0x0 ||
        (iVar4 = isLimitTerm((WhereTerm *)in_stack_ffffffffffffff70), iVar4 == 0)))) {
      *(undefined1 *)(local_50 + 5) = 1;
    }
    local_50 = local_50 + 0xc;
  }
  memset(aUsage,0,(long)iVar1 << 3);
  in_R8[0xc] = 0;
  in_R8[0xd] = 0;
  in_R8[10] = 0;
  in_R8[0xf] = 0;
  in_R8[0x10] = -0x5d7860d2;
  in_R8[0x11] = 0x546d42ae;
  in_R8[0x12] = 0x19;
  in_R8[0x13] = 0;
  in_R8[0x14] = 0;
  in_R8[0x1e] = 0;
  local_4 = vtabBestIndex(in_stack_ffffffffffffff70,
                          (Table *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          in_stack_ffffffffffffff60);
  if (local_4 == 0) {
    local_60 = -1;
    memset((void *)puVar2[8],0,(long)iVar1 << 3);
    memset(puVar2 + 3,0,0x18);
    local_50 = *(long *)(in_R8 + 2);
    for (local_5c = 0; local_5c < iVar1; local_5c = local_5c + 1) {
      iVar4 = aUsage[local_5c].argvIndex + -1;
      if (-1 < iVar4) {
        in_stack_ffffffffffffff5c = *(int *)(local_50 + 8);
        if ((((iVar1 <= iVar4) || (in_stack_ffffffffffffff5c < 0)) ||
            (pTerm_00 = termFromWhereClause(pWC_00,in_stack_ffffffffffffff5c),
            pTerm_00 == (WhereTerm *)0x0)) ||
           ((*(long *)(puVar2[8] + (long)iVar4 * 8) != 0 || (*(char *)(local_50 + 5) == '\0')))) {
          sqlite3ErrorMsg(pParse_00,"%s.xBestIndex malfunction",**(undefined8 **)&pTemplate->iTab);
          freeIdxStr((sqlite3_index_info *)0x205ffe);
          return 1;
        }
        *puVar2 = pTerm_00->prereqRight | *puVar2;
        *(WhereTerm **)(puVar2[8] + (long)iVar4 * 8) = pTerm_00;
        if (local_60 < iVar4) {
          local_60 = iVar4;
        }
        if (aUsage[local_5c].omit != '\0') {
          if ((local_5c < 0x10) && ((1 << ((byte)local_5c & 0x1f) & (uint)in_R9W) == 0)) {
            *(ushort *)((long)puVar2 + 0x1e) =
                 *(ushort *)((long)puVar2 + 0x1e) | (ushort)(1 << ((byte)iVar4 & 0x1f));
          }
          if (pTerm_00->eMatchOp == 'J') {
            *(byte *)((long)puVar2 + 0x1c) = *(byte *)((long)puVar2 + 0x1c) & 0xfd | 2;
          }
        }
        if (local_5c < 0x20) {
          in_stack_ffffffffffffff58 = 1 << ((byte)local_5c & 0x1f);
        }
        else {
          in_stack_ffffffffffffff58 = 0;
        }
        if ((in_stack_ffffffffffffff58 & in_R8[0x1e]) == 0) {
          if ((pTerm_00->eOperator & 1) != 0) {
            in_R8[0xf] = 0;
            in_R8[0x14] = in_R8[0x14] & 0xfffffffe;
            *in_stack_00000008 = 1;
          }
        }
        else {
          *(uint *)(puVar2 + 5) = 1 << ((byte)iVar4 & 0x1f) | (uint)puVar2[5];
        }
        iVar4 = isLimitTerm(pTerm_00);
        if ((iVar4 != 0) &&
           ((*in_stack_00000008 != 0 || (iVar4 = allConstraintsUsed(aUsage,local_5c), iVar4 == 0))))
        {
          freeIdxStr((sqlite3_index_info *)0x206184);
          *in_stack_00000010 = 1;
          return 0;
        }
      }
      local_50 = local_50 + 0xc;
    }
    *(short *)((long)puVar2 + 0x34) = (short)local_60 + 1;
    for (local_5c = 0; local_5c <= local_60; local_5c = local_5c + 1) {
      if (*(long *)(puVar2[8] + (long)local_5c * 8) == 0) {
        sqlite3ErrorMsg(pParse_00,"%s.xBestIndex malfunction",**(undefined8 **)&pTemplate->iTab);
        freeIdxStr((sqlite3_index_info *)0x20622a);
        return 1;
      }
    }
    *(int *)(puVar2 + 3) = in_R8[10];
    *(byte *)((long)puVar2 + 0x1c) = *(byte *)((long)puVar2 + 0x1c) & 0xfe | (byte)in_R8[0xe] & 1;
    in_R8[0xe] = 0;
    puVar2[4] = *(ulong *)(in_R8 + 0xc);
    if (in_R8[0xf] == 0) {
      local_ac = 0;
    }
    else {
      local_ac = (undefined1)in_R8[4];
    }
    *(undefined1 *)((long)puVar2 + 0x1d) = local_ac;
    *(byte *)((long)puVar2 + 0x1c) =
         *(byte *)((long)puVar2 + 0x1c) & 0xfb | ((in_R8[0x14] & 2U) != 0) << 2;
    *(undefined2 *)((long)puVar2 + 0x12) = 0;
    LVar3 = sqlite3LogEstFromDouble
                      ((double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    *(LogEst *)((long)puVar2 + 0x14) = LVar3;
    LVar3 = sqlite3LogEst(*(u64 *)(in_R8 + 0x12));
    *(LogEst *)((long)puVar2 + 0x16) = LVar3;
    if ((in_R8[0x14] & 1U) == 0) {
      *(uint *)(puVar2 + 6) = (uint)puVar2[6] & 0xffffefff;
    }
    else {
      *(uint *)(puVar2 + 6) = (uint)puVar2[6] | 0x1000;
    }
    local_4 = whereLoopInsert((WhereLoopBuilder *)pParse_00,pTemplate);
    if ((*(byte *)((long)puVar2 + 0x1c) & 1) != 0) {
      sqlite3_free((void *)0x2063b9);
      *(byte *)((long)puVar2 + 0x1c) = *(byte *)((long)puVar2 + 0x1c) & 0xfe;
    }
  }
  else if (local_4 == 0x13) {
    freeIdxStr((sqlite3_index_info *)0x205ec8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int whereLoopAddVirtualOne(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,                /* Mask of tables that must be used. */
  Bitmask mUsable,                /* Mask of usable tables */
  u16 mExclude,                   /* Exclude terms using these operators */
  sqlite3_index_info *pIdxInfo,   /* Populated object for xBestIndex */
  u16 mNoOmit,                    /* Do not omit these constraints */
  int *pbIn,                      /* OUT: True if plan uses an IN(...) op */
  int *pbRetryLimit               /* OUT: Retry without LIMIT/OFFSET */
){
  WhereClause *pWC = pBuilder->pWC;
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage = pIdxInfo->aConstraintUsage;
  int i;
  int mxTerm;
  int rc = SQLITE_OK;
  WhereLoop *pNew = pBuilder->pNew;
  Parse *pParse = pBuilder->pWInfo->pParse;
  SrcItem *pSrc = &pBuilder->pWInfo->pTabList->a[pNew->iTab];
  int nConstraint = pIdxInfo->nConstraint;

  assert( (mUsable & mPrereq)==mPrereq );
  *pbIn = 0;
  pNew->prereq = mPrereq;

  /* Set the usable flag on the subset of constraints identified by
  ** arguments mUsable and mExclude. */
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    WhereTerm *pTerm = termFromWhereClause(pWC, pIdxCons->iTermOffset);
    pIdxCons->usable = 0;
    if( (pTerm->prereqRight & mUsable)==pTerm->prereqRight
     && (pTerm->eOperator & mExclude)==0
     && (pbRetryLimit || !isLimitTerm(pTerm))
    ){
      pIdxCons->usable = 1;
    }
  }

  /* Initialize the output fields of the sqlite3_index_info structure */
  memset(pUsage, 0, sizeof(pUsage[0])*nConstraint);
  assert( pIdxInfo->needToFreeIdxStr==0 );
  pIdxInfo->idxStr = 0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = SQLITE_BIG_DBL / (double)2;
  pIdxInfo->estimatedRows = 25;
  pIdxInfo->idxFlags = 0;
  pHidden->mHandleIn = 0;

  /* Invoke the virtual table xBestIndex() method */
  rc = vtabBestIndex(pParse, pSrc->pSTab, pIdxInfo);
  if( rc ){
    if( rc==SQLITE_CONSTRAINT ){
      /* If the xBestIndex method returns SQLITE_CONSTRAINT, that means
      ** that the particular combination of parameters provided is unusable.
      ** Make no entries in the loop table.
      */
      WHERETRACE(0xffffffff, ("  ^^^^--- non-viable plan rejected!\n"));
      freeIdxStr(pIdxInfo);
      return SQLITE_OK;
    }
    return rc;
  }

  mxTerm = -1;
  assert( pNew->nLSlot>=nConstraint );
  memset(pNew->aLTerm, 0, sizeof(pNew->aLTerm[0])*nConstraint );
  memset(&pNew->u.vtab, 0, sizeof(pNew->u.vtab));
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    int iTerm;
    if( (iTerm = pUsage[i].argvIndex - 1)>=0 ){
      WhereTerm *pTerm;
      int j = pIdxCons->iTermOffset;
      if( iTerm>=nConstraint
       || j<0
       || (pTerm = termFromWhereClause(pWC, j))==0
       || pNew->aLTerm[iTerm]!=0
       || pIdxCons->usable==0
      ){
        sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pSTab->zName);
        freeIdxStr(pIdxInfo);
        return SQLITE_ERROR;
      }
      testcase( iTerm==nConstraint-1 );
      testcase( j==0 );
      testcase( j==pWC->nTerm-1 );
      pNew->prereq |= pTerm->prereqRight;
      assert( iTerm<pNew->nLSlot );
      pNew->aLTerm[iTerm] = pTerm;
      if( iTerm>mxTerm ) mxTerm = iTerm;
      testcase( iTerm==15 );
      testcase( iTerm==16 );
      if( pUsage[i].omit ){
        if( i<16 && ((1<<i)&mNoOmit)==0 ){
          testcase( i!=iTerm );
          pNew->u.vtab.omitMask |= 1<<iTerm;
        }else{
          testcase( i!=iTerm );
        }
        if( pTerm->eMatchOp==SQLITE_INDEX_CONSTRAINT_OFFSET ){
          pNew->u.vtab.bOmitOffset = 1;
        }
      }
      if( SMASKBIT32(i) & pHidden->mHandleIn ){
        pNew->u.vtab.mHandleIn |= MASKBIT32(iTerm);
      }else if( (pTerm->eOperator & WO_IN)!=0 ){
        /* A virtual table that is constrained by an IN clause may not
        ** consume the ORDER BY clause because (1) the order of IN terms
        ** is not necessarily related to the order of output terms and
        ** (2) Multiple outputs from a single IN value will not merge
        ** together.  */
        pIdxInfo->orderByConsumed = 0;
        pIdxInfo->idxFlags &= ~SQLITE_INDEX_SCAN_UNIQUE;
        *pbIn = 1; assert( (mExclude & WO_IN)==0 );
      }

      /* Unless pbRetryLimit is non-NULL, there should be no LIMIT/OFFSET
      ** terms. And if there are any, they should follow all other terms. */
      assert( pbRetryLimit || !isLimitTerm(pTerm) );
      assert( !isLimitTerm(pTerm) || i>=nConstraint-2 );
      assert( !isLimitTerm(pTerm) || i==nConstraint-1 || isLimitTerm(pTerm+1) );

      if( isLimitTerm(pTerm) && (*pbIn || !allConstraintsUsed(pUsage, i)) ){
        /* If there is an IN(...) term handled as an == (separate call to
        ** xFilter for each value on the RHS of the IN) and a LIMIT or
        ** OFFSET term handled as well, the plan is unusable. Similarly,
        ** if there is a LIMIT/OFFSET and there are other unused terms,
        ** the plan cannot be used. In these cases set variable *pbRetryLimit
        ** to true to tell the caller to retry with LIMIT and OFFSET
        ** disabled. */
        freeIdxStr(pIdxInfo);
        *pbRetryLimit = 1;
        return SQLITE_OK;
      }
    }
  }

  pNew->nLTerm = mxTerm+1;
  for(i=0; i<=mxTerm; i++){
    if( pNew->aLTerm[i]==0 ){
      /* The non-zero argvIdx values must be contiguous.  Raise an
      ** error if they are not */
      sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pSTab->zName);
      freeIdxStr(pIdxInfo);
      return SQLITE_ERROR;
    }
  }
  assert( pNew->nLTerm<=pNew->nLSlot );
  pNew->u.vtab.idxNum = pIdxInfo->idxNum;
  pNew->u.vtab.needFree = pIdxInfo->needToFreeIdxStr;
  pIdxInfo->needToFreeIdxStr = 0;
  pNew->u.vtab.idxStr = pIdxInfo->idxStr;
  pNew->u.vtab.isOrdered = (i8)(pIdxInfo->orderByConsumed ?
      pIdxInfo->nOrderBy : 0);
  pNew->u.vtab.bIdxNumHex = (pIdxInfo->idxFlags&SQLITE_INDEX_SCAN_HEX)!=0;
  pNew->rSetup = 0;
  pNew->rRun = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
  pNew->nOut = sqlite3LogEst(pIdxInfo->estimatedRows);

  /* Set the WHERE_ONEROW flag if the xBestIndex() method indicated
  ** that the scan will visit at most one row. Clear it otherwise. */
  if( pIdxInfo->idxFlags & SQLITE_INDEX_SCAN_UNIQUE ){
    pNew->wsFlags |= WHERE_ONEROW;
  }else{
    pNew->wsFlags &= ~WHERE_ONEROW;
  }
  rc = whereLoopInsert(pBuilder, pNew);
  if( pNew->u.vtab.needFree ){
    sqlite3_free(pNew->u.vtab.idxStr);
    pNew->u.vtab.needFree = 0;
  }
  WHERETRACE(0xffffffff, ("  bIn=%d prereqIn=%04llx prereqOut=%04llx\n",
                      *pbIn, (sqlite3_uint64)mPrereq,
                      (sqlite3_uint64)(pNew->prereq & ~mPrereq)));

  return rc;
}